

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  presentation_type pVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  char *digits;
  byte *pbVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  char *pcVar7;
  undefined1 *puVar8;
  uint uVar9;
  unsigned_long uVar10;
  char *pcVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  format_decimal_result<char_*> fVar20;
  char buffer [20];
  uint local_28c;
  anon_class_24_3_e2c60416 local_288;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248;
  undefined **local_240;
  undefined1 *local_238;
  ulong uStack_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  uStack_230 = 0;
  local_240 = &PTR_grow_001f5c90;
  local_228 = 500;
  pVar1 = specs->type;
  local_28c = prefix;
  local_238 = local_220;
  switch(pVar1) {
  case none:
  case dec:
    lVar3 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar13 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3]
                                      * 8));
    uVar17 = (ulong)uVar13;
    local_288.prefix = (uint *)0x0;
    local_288.grouping._0_6_ = 0;
    local_288.grouping._6_2_ = 0;
    local_288.buffer._0_4_ = 0;
    fVar20 = format_decimal<char,unsigned_long>((char *)&local_288,value,uVar13);
    copy_str_noinline<char,char*,fmt::v10::appender>
              ((char *)&local_288,fVar20.end,(appender)&local_240);
    break;
  case oct:
    uVar10 = value;
    uVar17 = 0;
    do {
      uVar18 = uVar17;
      uVar17 = uVar18 + 1;
      bVar19 = 7 < uVar10;
      uVar10 = uVar10 >> 3;
    } while (bVar19);
    if ((((specs->field_0x9 & 0x80) != 0) && (value != 0)) && (specs->precision <= (int)uVar17)) {
      uVar13 = 0x3000;
      if (prefix == 0) {
        uVar13 = 0x30;
      }
      local_28c = (uVar13 | prefix) + 0x1000000;
    }
    puVar8 = local_220;
    uVar4 = uVar17;
    if (500 < uVar17) {
      puVar8 = (undefined1 *)0x0;
      uVar4 = uStack_230;
    }
    uStack_230 = uVar4;
    if (puVar8 == (undefined1 *)0x0) {
      pbVar5 = (byte *)((long)&local_288.prefix + uVar18);
      local_288.prefix = (uint *)0x0;
      local_288.grouping._0_6_ = 0;
      local_288.grouping._6_2_ = 0;
      local_288.buffer._0_4_ = 0;
      local_288.buffer._4_2_ = 0;
      do {
        *pbVar5 = (byte)value & 7 | 0x30;
        pbVar5 = pbVar5 + -1;
        bVar19 = 7 < value;
        value = value >> 3;
      } while (bVar19);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_288,(char *)((long)&local_288.prefix + uVar18 + 1),
                 (appender)&local_240);
    }
    else {
      pbVar5 = puVar8 + uVar17;
      do {
        pbVar5 = pbVar5 + -1;
        *pbVar5 = (byte)value & 7 | 0x30;
        bVar19 = 7 < value;
        value = value >> 3;
      } while (bVar19);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar9 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar13 = uVar9 << 8;
      if (prefix == 0) {
        uVar13 = uVar9;
      }
      local_28c = (uVar13 | prefix) + 0x2000000;
    }
    uVar10 = value;
    uVar17 = 0;
    do {
      uVar18 = uVar17;
      uVar17 = uVar18 + 1;
      bVar19 = 0xf < uVar10;
      uVar10 = uVar10 >> 4;
    } while (bVar19);
    puVar8 = local_220;
    uVar4 = uVar17;
    if (500 < uVar17) {
      puVar8 = (undefined1 *)0x0;
      uVar4 = uStack_230;
    }
    uStack_230 = uVar4;
    if (puVar8 == (undefined1 *)0x0) {
      pcVar7 = (char *)((long)&local_288.prefix + uVar18);
      local_288.prefix = (uint *)0x0;
      local_288.grouping._0_6_ = 0;
      local_288.grouping._6_2_ = 0;
      local_288.buffer._0_4_ = (uint)local_288.buffer & 0xffffff00;
      pcVar11 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar11 = "0123456789ABCDEF";
      }
      do {
        *pcVar7 = pcVar11[(uint)value & 0xf];
        pcVar7 = pcVar7 + -1;
        bVar19 = 0xf < value;
        value = value >> 4;
      } while (bVar19);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_288,(char *)((long)&local_288.prefix + uVar18 + 1),
                 (appender)&local_240);
    }
    else {
      pcVar7 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar7 = "0123456789ABCDEF";
      }
      pcVar11 = puVar8 + uVar17;
      do {
        pcVar11 = pcVar11 + -1;
        *pcVar11 = pcVar7[(uint)value & 0xf];
        bVar19 = 0xf < value;
        value = value >> 4;
      } while (bVar19);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar9 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar13 = uVar9 << 8;
      if (prefix == 0) {
        uVar13 = uVar9;
      }
      local_28c = (uVar13 | prefix) + 0x2000000;
    }
    uVar10 = value;
    uVar17 = 0;
    do {
      uVar18 = uVar17;
      uVar17 = uVar18 + 1;
      bVar19 = 1 < uVar10;
      uVar10 = uVar10 >> 1;
    } while (bVar19);
    puVar8 = local_220;
    uVar4 = uVar17;
    if (500 < uVar17) {
      puVar8 = (undefined1 *)0x0;
      uVar4 = uStack_230;
    }
    uStack_230 = uVar4;
    if (puVar8 == (undefined1 *)0x0) {
      pbVar5 = (byte *)((long)&local_288.prefix + uVar18);
      local_258 = 0;
      uStack_250 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_288.buffer._0_4_ = 0;
      local_288.buffer._4_2_ = 0;
      local_288.buffer._6_2_ = 0;
      uStack_270 = 0;
      local_288.prefix = (uint *)0x0;
      local_288.grouping._0_6_ = 0;
      local_288.grouping._6_2_ = 0;
      local_248 = 0;
      do {
        *pbVar5 = (byte)value & 1 | 0x30;
        pbVar5 = pbVar5 + -1;
        bVar19 = 1 < value;
        value = value >> 1;
      } while (bVar19);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_288,(char *)((long)&local_288.prefix + uVar18 + 1),
                 (appender)&local_240);
    }
    else {
      pbVar5 = puVar8 + uVar17;
      do {
        pbVar5 = pbVar5 + -1;
        *pbVar5 = (byte)value & 1 | 0x30;
        bVar19 = 1 < value;
        value = value >> 1;
      } while (bVar19);
    }
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    local_288.prefix._0_2_ = CONCAT11((char)value,pVar1 == debug);
    bVar6.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                   (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_288);
    goto LAB_00131d20;
  }
  iVar16 = (int)uVar17;
  if (iVar16 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                ,0x189,"negative value");
  }
  pbVar5 = (byte *)(grouping->grouping_)._M_dataplus._M_p;
  pbVar12 = pbVar5 + (grouping->grouping_)._M_string_length;
  uVar13 = ((local_28c >> 0x18) + iVar16) - 1;
  iVar14 = 0;
  do {
    iVar15 = 0x7fffffff;
    if ((grouping->thousands_sep_)._M_string_length != 0) {
      if (pbVar5 == pbVar12) {
        uVar9 = (uint)(char)pbVar12[-1];
      }
      else {
        bVar2 = *pbVar5;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00131cef;
        pbVar5 = pbVar5 + 1;
        uVar9 = (uint)bVar2;
      }
      iVar14 = iVar14 + uVar9;
      iVar15 = iVar14;
    }
LAB_00131cef:
    uVar13 = uVar13 + 1;
  } while (iVar15 < iVar16);
  local_288.prefix = &local_28c;
  local_288.grouping._0_6_ = SUB86(grouping,0);
  local_288.grouping._6_2_ = (undefined2)((ulong)grouping >> 0x30);
  local_288.buffer._0_4_ = (uint)&local_240;
  local_288.buffer._4_2_ = (undefined2)((ulong)&local_240 >> 0x20);
  local_288.buffer._6_2_ = (undefined2)((ulong)&local_240 >> 0x30);
  bVar6.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 (out,specs,(ulong)uVar13,(ulong)uVar13,&local_288);
LAB_00131d20:
  if (local_238 != local_220) {
    operator_delete(local_238,local_228);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}